

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserexternalvariable.cpp
# Opt level: O0

void __thiscall
AnalyserExternalVariable_containsDependencyByPointer_Test::TestBody
          (AnalyserExternalVariable_containsDependencyByPointer_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  element_type *peVar4;
  element_type *peVar5;
  AssertionResult local_248 [2];
  AssertHelper local_228 [8];
  Message local_220 [8];
  shared_ptr<libcellml::Variable> local_218;
  bool local_201;
  undefined1 local_200 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_1d0 [8];
  Message local_1c8 [15];
  bool local_1b9;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_;
  string local_1a0 [39];
  allocator<char> local_179;
  string local_178 [32];
  shared_ptr<libcellml::Component> local_158;
  undefined1 local_148 [8];
  VariablePtr dependency;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [32];
  shared_ptr<libcellml::Component> local_e8;
  shared_ptr<libcellml::Variable> local_d8;
  undefined1 local_c8 [8];
  AnalyserExternalVariablePtr externalVariable;
  Message local_b0 [8];
  unsigned_long local_a8 [2];
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  allocator<char> local_71;
  string local_70 [32];
  string local_50 [32];
  undefined1 local_30 [8];
  ModelPtr model;
  ParserPtr parser;
  AnalyserExternalVariable_containsDependencyByPointer_Test *this_local;
  
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml",&local_71);
  fileContents(local_50);
  libcellml::Parser::parseModel((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  local_a8[1] = 0;
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_a8[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_98,"size_t(0)","parser->issueCount()",local_a8 + 1,local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &externalVariable.
                super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0xb8,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &externalVariable.
                super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_b0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &externalVariable.
                super___shared_ptr<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"membrane",&local_109);
  libcellml::ComponentEntity::component((string *)&local_e8,SUB81(peVar4,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"V",
             (allocator<char> *)
             ((long)&dependency.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::variable((string *)&local_d8);
  libcellml::AnalyserExternalVariable::create((shared_ptr *)local_c8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_d8);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&dependency.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_e8);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"membrane",&local_179);
  libcellml::ComponentEntity::component((string *)&local_158,SUB81(peVar4,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a0,"Cm",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Component::variable((string *)local_148);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_158);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator(&local_179);
  peVar5 = std::
           __shared_ptr_access<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_c8);
  libcellml::AnalyserExternalVariable::addDependency((shared_ptr *)peVar5);
  peVar5 = std::
           __shared_ptr_access<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_c8);
  bVar2 = libcellml::AnalyserExternalVariable::containsDependency((shared_ptr *)peVar5);
  local_1b9 = (bool)(bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b8,&local_1b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_1b8,
               "externalVariable->containsDependency(dependency)","false");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0xbf,pcVar3);
    testing::internal::AssertHelper::operator=(local_1d0,local_1c8);
    testing::internal::AssertHelper::~AssertHelper(local_1d0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  peVar5 = std::
           __shared_ptr_access<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::AnalyserExternalVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_c8);
  std::shared_ptr<libcellml::Variable>::shared_ptr(&local_218,(nullptr_t)0x0);
  bVar2 = libcellml::AnalyserExternalVariable::containsDependency((shared_ptr *)peVar5);
  local_201 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_200,&local_201,(type *)0x0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_218);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_248,local_200,"externalVariable->containsDependency(nullptr)","true");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserexternalvariable.cpp"
               ,0xc0,pcVar3);
    testing::internal::AssertHelper::operator=(local_228,local_220);
    testing::internal::AssertHelper::~AssertHelper(local_228);
    std::__cxx11::string::~string((string *)local_248);
    testing::Message::~Message(local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_148);
  std::shared_ptr<libcellml::AnalyserExternalVariable>::~shared_ptr
            ((shared_ptr<libcellml::AnalyserExternalVariable> *)local_c8);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(AnalyserExternalVariable, containsDependencyByPointer)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto externalVariable = libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V"));
    auto dependency = model->component("membrane")->variable("Cm");

    externalVariable->addDependency(dependency);

    EXPECT_TRUE(externalVariable->containsDependency(dependency));
    EXPECT_FALSE(externalVariable->containsDependency(nullptr));
}